

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManPropagateFlow(Jf_Man_t *p,int fEdge)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_00;
  long lVar3;
  long lVar4;
  
  p_00 = p->pGia;
  if (0 < p_00->nObjs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&p_00->pObjs->field_0x0 + lVar4);
      uVar1 = *(ulong *)pObj;
      uVar2 = (uint)uVar1;
      if (((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar2 & 0x1fffffff) == ((uint)(uVar1 >> 0x20) & 0x1fffffff))) {
        Gia_ObjId(p_00,pObj);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if ((uVar1 & 0xc0000000) == 0 && (~uVar2 & 0x1fffffff) != 0) {
        Jf_ObjComputeBestCut(p,pObj,fEdge,0);
      }
      lVar3 = lVar3 + 1;
      p_00 = p->pGia;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < p_00->nObjs);
  }
  Jf_ManComputeRefs(p);
  return;
}

Assistant:

void Jf_ManPropagateFlow( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; 
    int i;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) && Jf_ObjIsUnit(pObj) )
            Jf_ObjComputeBestCut( p, pObj, fEdge, 0 );
    Jf_ManComputeRefs( p );
}